

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O0

void __thiscall
glslang::TReflectionTraverser::visitSymbol(TReflectionTraverser *this,TIntermSymbol *base)

{
  bool bVar1;
  int iVar2;
  EShLanguage EVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  TIntermSymbol *base_local;
  TReflectionTraverser *this_local;
  
  iVar2 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])();
  if (((uint)*(undefined8 *)(CONCAT44(extraout_var,iVar2) + 8) & 0x7f) == 5) {
    iVar2 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x20])();
    if (iVar2 == 0x10) {
      if ((this->reflection->options & EShReflectionSharedStd140UBO) != EShReflectionDefault) {
        addUniform(this,base);
      }
    }
    else {
      addUniform(this,base);
    }
  }
  if (((((this->reflection->options & EShReflectionSharedStd140SSBO) != EShReflectionDefault) &&
       (iVar2 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])(),
       ((uint)*(undefined8 *)(CONCAT44(extraout_var_00,iVar2) + 8) & 0x7f) == 6)) &&
      (iVar2 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x20])(),
      iVar2 == 0x10)) &&
     ((iVar2 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])(),
      (*(byte *)(CONCAT44(extraout_var_01,iVar2) + 0x10) & 0xf) == 2 ||
      (iVar2 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])(),
      (*(byte *)(CONCAT44(extraout_var_02,iVar2) + 0x10) & 0xf) == 1)))) {
    addUniform(this,base);
  }
  EVar3 = TIntermediate::getStage(this->intermediate);
  if (EVar3 == this->reflection->firstStage) {
    iVar2 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])();
    bVar1 = TQualifier::isPipeInput((TQualifier *)CONCAT44(extraout_var_03,iVar2));
    if (bVar1) goto LAB_00547901;
  }
  EVar3 = TIntermediate::getStage(this->intermediate);
  if (EVar3 != this->reflection->lastStage) {
    return;
  }
  iVar2 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])();
  bVar1 = TQualifier::isPipeOutput((TQualifier *)CONCAT44(extraout_var_04,iVar2));
  if (!bVar1) {
    return;
  }
LAB_00547901:
  addPipeIOVariable(this,base);
  return;
}

Assistant:

void TReflectionTraverser::visitSymbol(TIntermSymbol* base)
{
    if (base->getQualifier().storage == EvqUniform) {
        if (base->getBasicType() == EbtBlock) {
            if (reflection.options & EShReflectionSharedStd140UBO) {
                addUniform(*base);
            }
        } else {
            addUniform(*base);
        }
    }

    // #TODO add std140/layout active rules for ssbo, same with ubo.
    // Storage buffer blocks will be collected and expanding in this part.
    if((reflection.options & EShReflectionSharedStd140SSBO) &&
       (base->getQualifier().storage == EvqBuffer && base->getBasicType() == EbtBlock &&
        (base->getQualifier().layoutPacking == ElpStd140 || base->getQualifier().layoutPacking == ElpShared)))
        addUniform(*base);

    if ((intermediate.getStage() == reflection.firstStage && base->getQualifier().isPipeInput()) ||
        (intermediate.getStage() == reflection.lastStage && base->getQualifier().isPipeOutput()))
        addPipeIOVariable(*base);
}